

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::PopSnapshot(cmMakefile *this,bool reportError)

{
  cmStateSnapshot *this_00;
  bool bVar1;
  char *__end;
  undefined1 local_50 [32];
  
  this_00 = &this->StateSnapshot;
  bVar1 = cmStateSnapshot::CanPopPolicyScope(this_00);
  if (!bVar1) {
    do {
      if ((reportError & 1U) != 0) {
        local_50._0_8_ = (cmState *)(local_50 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"cmake_policy PUSH without matching POP","");
        IssueMessage(this,FATAL_ERROR,(string *)local_50);
        if ((cmState *)local_50._0_8_ != (cmState *)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
        }
        reportError = false;
      }
      PopPolicy(this);
      bVar1 = cmStateSnapshot::CanPopPolicyScope(this_00);
    } while (!bVar1);
  }
  cmState::Pop((cmStateSnapshot *)local_50,
               (this->GlobalGenerator->CMakeInstance->State)._M_t.
               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
               super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl,this_00);
  (this->StateSnapshot).Position.Position = local_50._16_8_;
  this_00->State = (cmState *)local_50._0_8_;
  (this->StateSnapshot).Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_50._8_8_;
  bVar1 = cmStateSnapshot::IsValid(this_00);
  if (bVar1) {
    return;
  }
  __assert_fail("this->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMakefile.cxx"
                ,0x1103,"void cmMakefile::PopSnapshot(bool)");
}

Assistant:

void cmMakefile::PopSnapshot(bool reportError)
{
  // cmStateSnapshot manages nested policy scopes within it.
  // Since the scope corresponding to the snapshot is closing,
  // reject any still-open nested policy scopes with an error.
  while (!this->StateSnapshot.CanPopPolicyScope()) {
    if (reportError) {
      this->IssueMessage(MessageType::FATAL_ERROR,
                         "cmake_policy PUSH without matching POP");
      reportError = false;
    }
    this->PopPolicy();
  }

  this->StateSnapshot = this->GetState()->Pop(this->StateSnapshot);
  assert(this->StateSnapshot.IsValid());
}